

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Operation<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<duckdb::string_t,_double> *state,string_t *x,double *y,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  string_t x_data;
  
  if (*this != (ArgMinMaxBase<duckdb::LessThan,false>)0x0) {
    x_data.value.pointer.ptr = (char *)y;
    x_data.value._0_8_ = *(undefined8 *)&(state->arg).value;
    Execute<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
              (this,*(ArgMinMaxState<duckdb::string_t,_double> **)state,x_data,*(double *)&x->value,
               binary);
    return;
  }
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    ((TemplatedValidityMask<unsigned_long> *)y[2],(idx_t)y[4]);
  if (bVar1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)y[1],(idx_t)y[3]);
    Assign<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
              ((ArgMinMaxState<duckdb::string_t,_double> *)this,(string_t *)state,(double *)x,!bVar1
              );
    *this = (ArgMinMaxBase<duckdb::LessThan,false>)0x1;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}